

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdRequestExecuteJson(void *handle,char *name,char *json_string,char **response_json_string)

{
  bool bVar1;
  char *pcVar2;
  CfdException *this;
  int iVar3;
  allocator local_a9;
  string local_a8;
  string local_88;
  string result;
  string command;
  
  if (response_json_string == (char **)0x0 || (json_string == (char *)0x0 || name == (char *)0x0)) {
    iVar3 = 1;
  }
  else {
    result._M_dataplus._M_p = (pointer)&result.field_2;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&command,name,(allocator *)&local_88);
    bVar1 = std::operator==(&command,"ElementsDecodeRawTransaction");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_a8,json_string,&local_a9);
      cfd::api::json::JsonMappingApi::ElementsDecodeRawTransaction(&local_88,&local_a8);
    }
    else {
      bVar1 = std::operator==(&command,"DecodeRawTransaction");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_a8,json_string,&local_a9);
        cfd::api::json::JsonMappingApi::DecodeRawTransaction(&local_88,&local_a8);
      }
      else {
        bVar1 = std::operator==(&command,"DecodePsbt");
        if (!bVar1) {
          this = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_88,"unknown request name.",(allocator *)&local_a8);
          cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,&local_88);
          __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                     );
        }
        std::__cxx11::string::string((string *)&local_a8,json_string,&local_a9);
        cfd::api::json::JsonMappingApi::DecodePsbt(&local_88,&local_a8);
      }
    }
    std::__cxx11::string::operator=((string *)&result,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    if (result._M_string_length != 0) {
      pcVar2 = cfd::capi::CreateString(&result);
      *response_json_string = pcVar2;
    }
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::string::~string((string *)&result);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int CfdRequestExecuteJson(
    void* handle, const char* name, const char* json_string,
    char** response_json_string) {
#ifndef CFD_DISABLE_JSONAPI
  using cfd::api::json::JsonMappingApi;
  try {
    if ((name == nullptr) || (json_string == nullptr) ||
        (response_json_string == nullptr)) {
      return kCfdIllegalArgumentError;
    }

    std::string result;
    std::string command(name);
    if (command == "ElementsDecodeRawTransaction") {
#ifndef CFD_DISABLE_ELEMENTS
      result = JsonMappingApi::ElementsDecodeRawTransaction(
          std::string(json_string));
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "elements not support.");
#endif  // CFD_DISABLE_ELEMENTS
    } else if (command == "DecodeRawTransaction") {
      result = JsonMappingApi::DecodeRawTransaction(std::string(json_string));
    } else if (command == "DecodePsbt") {
      result = JsonMappingApi::DecodePsbt(std::string(json_string));
    } else {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "unknown request name.");
    }

    if (!result.empty() && (response_json_string != nullptr)) {
      *response_json_string = cfd::capi::CreateString(result);
    }
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
#else
  return kCfdIllegalStateError;
#endif  // CFD_DISABLE_JSONAPI
}